

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::ts_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,
          bool include_callback)

{
  t_field *field;
  bool bVar1;
  int iVar2;
  t_type *ptVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined3 in_register_00000009;
  pointer pptVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  t_struct *ptVar6;
  string exception_types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a4;
  pointer local_a0;
  string local_98;
  t_struct *local_78;
  string local_70;
  string local_50;
  
  local_a4 = CONCAT31(in_register_00000009,include_callback);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar6 = tfunction->arglist_;
  std::operator+(&local_c8,&tfunction->name_,"(");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  pptVar4 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_78 = ptVar6;
  while (pptVar4 !=
         (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    field = *pptVar4;
    local_a0 = pptVar4;
    ts_get_req_abi_cxx11_(&local_98,this,field);
    std::operator+(&local_e8,&field->name_,&local_98);
    std::operator+(&local_108,&local_e8,": ");
    ts_get_type_abi_cxx11_(&local_70,this,(*local_a0)->type_);
    std::operator+(&local_c8,&local_108,&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_98);
    ptVar6 = local_78;
    pptVar4 = local_a0 + 1;
    if ((pptVar4 !=
         (local_78->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (((char)local_a4 != '\0' &&
        (pptVar4 !=
         (local_78->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_start)))) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if ((char)local_a4 == '\0') {
    if (this->gen_es6_ == true) {
      ts_get_type_abi_cxx11_(&local_e8,this,tfunction->returntype_);
      std::operator+(&local_108,"): Promise<",&local_e8);
      std::operator+(&local_c8,&local_108,">;");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      ts_get_type_abi_cxx11_(&local_e8,this,tfunction->returntype_);
      std::operator+(&local_108,"): ",&local_e8);
      std::operator+(&local_c8,&local_108,";");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  else {
    if (this->gen_node_ == true) {
      ptVar6 = tfunction->xceptions_;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      if (ptVar6 != (t_struct *)0x0) {
        for (pptVar4 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pptVar4 !=
            (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
          ptVar3 = t_type::get_true_type((*pptVar4)->type_);
          if (pptVar4 ==
              (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            js_type_namespace_abi_cxx11_(&local_e8,this,ptVar3->program_);
            iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[3])(ptVar3);
            std::operator+(&local_108,&local_e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar2));
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            psVar5 = &local_e8;
          }
          else {
            js_type_namespace_abi_cxx11_(&local_98,this,ptVar3->program_);
            std::operator+(&local_e8," | ",&local_98);
            iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[3])(ptVar3);
            std::operator+(&local_108,&local_e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar2));
            std::__cxx11::string::append((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_e8);
            psVar5 = &local_98;
          }
          std::__cxx11::string::~string((string *)psVar5);
        }
      }
      bVar1 = std::operator==(&local_c8,"");
      if (bVar1) {
        ts_get_type_abi_cxx11_(&local_98,this,tfunction->returntype_);
        std::operator+(&local_e8,"callback?: (error: void, response: ",&local_98);
        std::operator+(&local_108,&local_e8,")=>void): ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e8);
        psVar5 = &local_98;
      }
      else {
        std::operator+(&local_70,"callback?: (error: ",&local_c8);
        std::operator+(&local_98,&local_70,", response: ");
        ts_get_type_abi_cxx11_(&local_50,this,tfunction->returntype_);
        std::operator+(&local_e8,&local_98,&local_50);
        std::operator+(&local_108,&local_e8,")=>void): ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_98);
        psVar5 = &local_70;
      }
      std::__cxx11::string::~string((string *)psVar5);
      this_00 = &local_c8;
    }
    else {
      ts_get_type_abi_cxx11_(&local_e8,this,tfunction->returntype_);
      std::operator+(&local_108,"callback?: (data: ",&local_e8);
      std::operator+(&local_c8,&local_108,")=>void): ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_108);
      this_00 = &local_e8;
    }
    std::__cxx11::string::~string((string *)this_00);
    if (this->gen_jquery_ != true) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    ts_get_type_abi_cxx11_(&local_e8,this,tfunction->returntype_);
    std::operator+(&local_108,"JQueryPromise<",&local_e8);
    std::operator+(&local_c8,&local_108,">;");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::string t_js_generator::ts_function_signature(t_function* tfunction, bool include_callback) {
  string str;
  const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  str = tfunction->get_name() + "(";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    str += (*f_iter)->get_name() + ts_get_req(*f_iter) + ": " + ts_get_type((*f_iter)->get_type());

    if (f_iter + 1 != fields.end() || (include_callback && fields.size() > 0)) {
      str += ", ";
    }
  }

  if (include_callback) {
    if (gen_node_) {
      t_struct* exceptions = tfunction->get_xceptions();
      string exception_types;
      if (exceptions) {
        const vector<t_field*>& members = exceptions->get_members();
        for (vector<t_field*>::const_iterator it = members.begin(); it != members.end(); ++it) {
          t_type* t = get_true_type((*it)->get_type());
          if (it == members.begin()) {
            exception_types = js_type_namespace(t->get_program()) + t->get_name();
          } else {
            exception_types += " | " + js_type_namespace(t->get_program()) + t->get_name();
          }
        }
      }
      if (exception_types == "") {
        str += "callback?: (error: void, response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      } else {
        str += "callback?: (error: " + exception_types + ", response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      }
    } else {
      str += "callback?: (data: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
    }

    if (gen_jquery_) {
      str += "JQueryPromise<" + ts_get_type(tfunction->get_returntype()) +">;";
    } else {
      str += "void;";
    }
  } else {
    if (gen_es6_) {
      str += "): Promise<" + ts_get_type(tfunction->get_returntype()) + ">;";
    }
    else {
      str += "): " + ts_get_type(tfunction->get_returntype()) + ";";
    }
  }

  return str;
}